

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Householder.h
# Opt level: O2

void __thiscall
Eigen::MatrixBase<Eigen::Block<Eigen::Matrix<float,-1,1,0,-1,1>,-1,-1,false>>::
applyHouseholderOnTheLeft<Eigen::Block<Eigen::Block<Eigen::Matrix<float,_1,_1,0,_1,_1>const,_1,_1,true>const,_1,1,false>>
          (MatrixBase<Eigen::Block<Eigen::Matrix<float,_1,1,0,_1,1>,_1,_1,false>> *this,
          Block<const_Eigen::Block<const_Eigen::Matrix<float,__1,__1,_0,__1,__1>,__1,__1,_true>,__1,_1,_false>
          *essential,Scalar *tau,Scalar *workspace)

{
  long lVar1;
  Block<const_Eigen::Block<const_Eigen::Matrix<float,__1,__1,_0,__1,__1>,__1,__1,_true>,__1,_1,_false>
  *pBVar2;
  RhsNested *pRVar3;
  CwiseBinaryOp<Eigen::internal::scalar_product_op<float,_float>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,_const_Eigen::Matrix<float,__1,_1,_0,__1,_1>_>,_const_Eigen::Block<const_Eigen::Block<const_Eigen::Matrix<float,__1,__1,_0,__1,__1>,__1,__1,_true>,__1,_1,_false>_>
  *pCVar4;
  undefined8 *puVar5;
  byte bVar6;
  Map<Eigen::Matrix<float,_1,__1,_1,_1,_1>,_0,_Eigen::Stride<0,_0>_> *local_218;
  Map<Eigen::Matrix<float,_1,__1,_1,_1,_1>,_0,_Eigen::Stride<0,_0>_> tmp;
  CwiseBinaryOp<Eigen::internal::scalar_product_op<float,_float>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,_const_Eigen::Matrix<float,__1,_1,_0,__1,_1>_>,_const_Eigen::Block<const_Eigen::Block<const_Eigen::Matrix<float,__1,__1,_0,__1,__1>,__1,__1,_true>,__1,_1,_false>_>
  local_1f0;
  undefined1 local_168 [24];
  undefined8 local_150 [14];
  variable_if_dynamic<long,__1> local_e0;
  variable_if_dynamic<long,__1> vStack_d8;
  XprTypeNested local_d0;
  Block<Eigen::Block<Eigen::Matrix<float,__1,_1,_0,__1,_1>,__1,__1,_false>,__1,__1,_false> bottom;
  
  bVar6 = 0;
  if (*(long *)(this + 8) == 1) {
    local_168._0_4_ = 1.0 - *tau;
    DenseBase<Eigen::Block<Eigen::Matrix<float,_-1,_1,_0,_-1,_1>,_-1,_-1,_false>_>::operator*=
              ((DenseBase<Eigen::Block<Eigen::Matrix<float,__1,_1,_0,__1,_1>,__1,__1,_false>_> *)
               this,(Scalar *)local_168);
  }
  else if ((*tau != 0.0) || (NAN(*tau))) {
    MapBase<Eigen::Map<Eigen::Matrix<float,_1,_-1,_1,_1,_1>,_0,_Eigen::Stride<0,_0>_>,_0>::MapBase
              ((MapBase<Eigen::Map<Eigen::Matrix<float,_1,__1,_1,_1,_1>,_0,_Eigen::Stride<0,_0>_>,_0>
                *)&tmp,workspace,*(Index *)(this + 0x10));
    Block<Eigen::Block<Eigen::Matrix<float,_-1,_1,_0,_-1,_1>,_-1,_-1,_false>,_-1,_-1,_false>::Block
              (&bottom,(Block<Eigen::Matrix<float,__1,_1,_0,__1,_1>,__1,__1,_false> *)this,1,0,
               *(long *)(this + 8) + -1,*(Index *)(this + 0x10));
    pBVar2 = essential;
    pCVar4 = &local_1f0;
    for (lVar1 = 0xd; lVar1 != 0; lVar1 = lVar1 + -1) {
      (((non_const_type *)&pCVar4->field_0x0)->
      super_BlockImpl<const_Eigen::Block<const_Eigen::Matrix<float,__1,__1,_0,__1,__1>,__1,__1,_true>,__1,_1,_false,_Eigen::Dense>
      ).
      super_BlockImpl_dense<const_Eigen::Block<const_Eigen::Matrix<float,__1,__1,_0,__1,__1>,__1,__1,_true>,__1,_1,_false,_true>
      .
      super_MapBase<Eigen::Block<const_Eigen::Block<const_Eigen::Matrix<float,__1,__1,_0,__1,__1>,__1,__1,_true>,__1,_1,_false>,_0>
      .m_data = (pBVar2->
                super_BlockImpl<const_Eigen::Block<const_Eigen::Matrix<float,__1,__1,_0,__1,__1>,__1,__1,_true>,__1,_1,_false,_Eigen::Dense>
                ).
                super_BlockImpl_dense<const_Eigen::Block<const_Eigen::Matrix<float,__1,__1,_0,__1,__1>,__1,__1,_true>,__1,_1,_false,_true>
                .
                super_MapBase<Eigen::Block<const_Eigen::Block<const_Eigen::Matrix<float,__1,__1,_0,__1,__1>,__1,__1,_true>,__1,_1,_false>,_0>
                .m_data;
      pBVar2 = (Block<const_Eigen::Block<const_Eigen::Matrix<float,__1,__1,_0,__1,__1>,__1,__1,_true>,__1,_1,_false>
                *)((long)pBVar2 + ((ulong)bVar6 * -2 + 1) * 8);
      pCVar4 = (CwiseBinaryOp<Eigen::internal::scalar_product_op<float,_float>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,_const_Eigen::Matrix<float,__1,_1,_0,__1,_1>_>,_const_Eigen::Block<const_Eigen::Block<const_Eigen::Matrix<float,__1,__1,_0,__1,__1>,__1,__1,_true>,__1,_1,_false>_>
                *)((long)pCVar4 + ((ulong)bVar6 * -2 + 1) * 8);
    }
    Product<Eigen::Transpose<const_Eigen::Block<const_Eigen::Block<const_Eigen::Matrix<float,_-1,_-1,_0,_-1,_-1>,_-1,_-1,_true>,_-1,_1,_false>_>,_Eigen::Block<Eigen::Block<Eigen::Matrix<float,_-1,_1,_0,_-1,_1>,_-1,_-1,_false>,_-1,_-1,_false>,_0>
    ::Product((Product<Eigen::Transpose<const_Eigen::Block<const_Eigen::Block<const_Eigen::Matrix<float,__1,__1,_0,__1,__1>,__1,__1,_true>,__1,_1,_false>_>,_Eigen::Block<Eigen::Block<Eigen::Matrix<float,__1,_1,_0,__1,_1>,__1,__1,_false>,__1,__1,_false>,_0>
               *)local_168,(Lhs *)&local_1f0,&bottom);
    local_218 = &tmp;
    NoAlias<Eigen::Map<Eigen::Matrix<float,1,-1,1,1,1>,0,Eigen::Stride<0,0>>,Eigen::MatrixBase>::
    operator=((NoAlias<Eigen::Map<Eigen::Matrix<float,1,_1,1,1,1>,0,Eigen::Stride<0,0>>,Eigen::MatrixBase>
               *)&local_218,
              (MatrixBase<Eigen::Product<Eigen::Transpose<const_Eigen::Block<const_Eigen::Block<const_Eigen::Matrix<float,__1,__1,_0,__1,__1>,__1,__1,_true>,__1,_1,_false>_>,_Eigen::Block<Eigen::Block<Eigen::Matrix<float,__1,_1,_0,__1,_1>,__1,__1,_false>,__1,__1,_false>,_0>_>
               *)local_168);
    Block<Eigen::Block<Eigen::Matrix<float,_-1,_1,_0,_-1,_1>,_-1,_-1,_false>,_1,_-1,_false>::Block
              ((Block<Eigen::Block<Eigen::Matrix<float,__1,_1,_0,__1,_1>,__1,__1,_false>,_1,__1,_false>
                *)local_168,(Block<Eigen::Matrix<float,__1,_1,_0,__1,_1>,__1,__1,_false> *)this,0);
    MatrixBase<Eigen::Map<Eigen::Matrix<float,1,-1,1,1,1>,0,Eigen::Stride<0,0>>>::operator+=
              ((MatrixBase<Eigen::Map<Eigen::Matrix<float,1,_1,1,1,1>,0,Eigen::Stride<0,0>>> *)&tmp,
               (MatrixBase<Eigen::Block<Eigen::Block<Eigen::Matrix<float,__1,_1,_0,__1,_1>,__1,__1,_false>,_1,__1,_false>_>
                *)local_168);
    Eigen::operator*((CwiseBinaryOp<Eigen::internal::scalar_product_op<float,_float>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,_const_Eigen::Matrix<float,_1,__1,_1,_1,_1>_>,_const_Eigen::Map<Eigen::Matrix<float,_1,__1,_1,_1,_1>,_0,_Eigen::Stride<0,_0>_>_>
                      *)&local_1f0,tau,(StorageBaseType *)&tmp);
    Block<Eigen::Block<Eigen::Matrix<float,_-1,_1,_0,_-1,_1>,_-1,_-1,_false>,_1,_-1,_false>::Block
              ((Block<Eigen::Block<Eigen::Matrix<float,__1,_1,_0,__1,_1>,__1,__1,_false>,_1,__1,_false>
                *)local_168,(Block<Eigen::Matrix<float,__1,_1,_0,__1,_1>,__1,__1,_false> *)this,0);
    MatrixBase<Eigen::Block<Eigen::Block<Eigen::Matrix<float,-1,1,0,-1,1>,-1,-1,false>,1,-1,false>>
    ::operator-=((MatrixBase<Eigen::Block<Eigen::Block<Eigen::Matrix<float,_1,1,0,_1,1>,_1,_1,false>,1,_1,false>>
                  *)local_168,
                 (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<float,_float>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,_const_Eigen::Matrix<float,_1,__1,_1,_1,_1>_>,_const_Eigen::Map<Eigen::Matrix<float,_1,__1,_1,_1,_1>,_0,_Eigen::Stride<0,_0>_>_>_>
                  *)&local_1f0);
    Eigen::operator*(&local_1f0,tau,(StorageBaseType *)essential);
    local_168._8_8_ = local_1f0.m_lhs.m_rows.m_value;
    local_168._20_4_ = local_1f0.m_lhs.m_functor.m_other;
    pRVar3 = &local_1f0.m_rhs;
    puVar5 = local_150;
    for (lVar1 = 0xd; lVar1 != 0; lVar1 = lVar1 + -1) {
      *puVar5 = (pRVar3->
                super_BlockImpl<const_Eigen::Block<const_Eigen::Matrix<float,__1,__1,_0,__1,__1>,__1,__1,_true>,__1,_1,_false,_Eigen::Dense>
                ).
                super_BlockImpl_dense<const_Eigen::Block<const_Eigen::Matrix<float,__1,__1,_0,__1,__1>,__1,__1,_true>,__1,_1,_false,_true>
                .
                super_MapBase<Eigen::Block<const_Eigen::Block<const_Eigen::Matrix<float,__1,__1,_0,__1,__1>,__1,__1,_true>,__1,_1,_false>,_0>
                .m_data;
      pRVar3 = (RhsNested *)((long)pRVar3 + ((ulong)bVar6 * -2 + 1) * 8);
      puVar5 = puVar5 + (ulong)bVar6 * -2 + 1;
    }
    local_d0 = (XprTypeNested)
               tmp.
               super_MapBase<Eigen::Map<Eigen::Matrix<float,_1,__1,_1,_1,_1>,_0,_Eigen::Stride<0,_0>_>,_1>
               .
               super_MapBase<Eigen::Map<Eigen::Matrix<float,_1,__1,_1,_1,_1>,_0,_Eigen::Stride<0,_0>_>,_0>
               .m_cols.m_value;
    local_e0.m_value =
         (long)tmp.
               super_MapBase<Eigen::Map<Eigen::Matrix<float,_1,__1,_1,_1,_1>,_0,_Eigen::Stride<0,_0>_>,_1>
               .
               super_MapBase<Eigen::Map<Eigen::Matrix<float,_1,__1,_1,_1,_1>,_0,_Eigen::Stride<0,_0>_>,_0>
               .m_data;
    vStack_d8.m_value =
         tmp.
         super_MapBase<Eigen::Map<Eigen::Matrix<float,_1,__1,_1,_1,_1>,_0,_Eigen::Stride<0,_0>_>,_1>
         .
         super_MapBase<Eigen::Map<Eigen::Matrix<float,_1,__1,_1,_1,_1>,_0,_Eigen::Stride<0,_0>_>,_0>
         ._8_8_;
    local_218 = (Map<Eigen::Matrix<float,_1,__1,_1,_1,_1>,_0,_Eigen::Stride<0,_0>_> *)&bottom;
    NoAlias<Eigen::Block<Eigen::Block<Eigen::Matrix<float,-1,1,0,-1,1>,-1,-1,false>,-1,-1,false>,Eigen::MatrixBase>
    ::operator-=((NoAlias<Eigen::Block<Eigen::Block<Eigen::Matrix<float,_1,1,0,_1,1>,_1,_1,false>,_1,_1,false>,Eigen::MatrixBase>
                  *)&local_218,
                 (MatrixBase<Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<float,_float>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,_const_Eigen::Matrix<float,__1,_1,_0,__1,_1>_>,_const_Eigen::Block<const_Eigen::Block<const_Eigen::Matrix<float,__1,__1,_0,__1,__1>,__1,__1,_true>,__1,_1,_false>_>,_Eigen::Map<Eigen::Matrix<float,_1,__1,_1,_1,_1>,_0,_Eigen::Stride<0,_0>_>,_0>_>
                  *)local_168);
  }
  return;
}

Assistant:

EIGEN_DEVICE_FUNC
void MatrixBase<Derived>::applyHouseholderOnTheLeft(
  const EssentialPart& essential,
  const Scalar& tau,
  Scalar* workspace)
{
  if(rows() == 1)
  {
    *this *= Scalar(1)-tau;
  }
  else if(tau!=Scalar(0))
  {
    Map<typename internal::plain_row_type<PlainObject>::type> tmp(workspace,cols());
    Block<Derived, EssentialPart::SizeAtCompileTime, Derived::ColsAtCompileTime> bottom(derived(), 1, 0, rows()-1, cols());
    tmp.noalias() = essential.adjoint() * bottom;
    tmp += this->row(0);
    this->row(0) -= tau * tmp;
    bottom.noalias() -= tau * essential * tmp;
  }
}